

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall
sf::String::substring(String *__return_storage_ptr__,String *this,size_t position,size_t length)

{
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_30
  ;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::substr
            (&local_30,&this->m_string,position,length);
  (__return_storage_ptr__->m_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_string).field_2;
  std::__cxx11::
  basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>::
  _M_construct<unsigned_int*>
            ((basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
              *)__return_storage_ptr__,local_30._M_dataplus._M_p,
             local_30._M_dataplus._M_p + local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

String String::substring(std::size_t position, std::size_t length) const
{
    return m_string.substr(position, length);
}